

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

void __thiscall
cmGeneratorTarget::ComputeLinkInterface
          (cmGeneratorTarget *this,string *config,cmOptionalLinkInterface *iface,
          cmGeneratorTarget *headTarget)

{
  bool bVar1;
  TargetType TVar2;
  PolicyStatus PVar3;
  reference __obj;
  reference pcVar4;
  pointer pcVar5;
  cmLinkImplementationLibraries *pcVar6;
  ulong uVar7;
  char *pcVar8;
  allocator local_171;
  string local_170;
  char *local_150;
  char *reps;
  char *config_reps;
  undefined1 local_138 [8];
  string propName;
  allocator local_f1;
  string local_f0 [8];
  string suffix;
  cmLinkImplementation *impl_2;
  cmLinkImplementationLibraries *impl_1;
  bool local_b0;
  __normal_iterator<const_cmLinkImplItem_*,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>
  local_a8;
  __normal_iterator<const_cmLinkImplItem_*,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>
  local_a0;
  const_iterator li_1;
  cmLinkImplementation *impl;
  pair<cmsys::_Hashtable_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>,_bool>
  local_80;
  __normal_iterator<cmLinkItem_*,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_> local_68;
  __normal_iterator<cmLinkItem_*,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_> local_60;
  __normal_iterator<const_cmLinkItem_*,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_>
  local_58;
  const_iterator li;
  hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
  emitted;
  cmGeneratorTarget *headTarget_local;
  cmOptionalLinkInterface *iface_local;
  string *config_local;
  cmGeneratorTarget *this_local;
  
  if (iface->ExplicitLibraries == (char *)0x0) {
    PVar3 = GetPolicyStatusCMP0022(this);
    if ((PVar3 == WARN) || (PVar3 = GetPolicyStatusCMP0022(this), PVar3 == OLD)) {
      pcVar6 = GetLinkImplementationLibrariesInternal(this,config,headTarget);
      (iface->super_cmLinkInterface).ImplementationIsInterface = true;
      std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::operator=
                (&(iface->super_cmLinkInterface).WrongConfigLibraries,&pcVar6->WrongConfigLibraries)
      ;
    }
  }
  else {
    TVar2 = GetType(this);
    if (((TVar2 == SHARED_LIBRARY) || (TVar2 = GetType(this), TVar2 == STATIC_LIBRARY)) ||
       (TVar2 = GetType(this), TVar2 == INTERFACE_LIBRARY)) {
      cmsys::
      hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
      ::hash_set((hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
                  *)&li);
      local_60._M_current =
           (cmLinkItem *)
           std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::begin
                     ((vector<cmLinkItem,_std::allocator<cmLinkItem>_> *)iface);
      __gnu_cxx::
      __normal_iterator<cmLinkItem_const*,std::vector<cmLinkItem,std::allocator<cmLinkItem>>>::
      __normal_iterator<cmLinkItem*>
                ((__normal_iterator<cmLinkItem_const*,std::vector<cmLinkItem,std::allocator<cmLinkItem>>>
                  *)&local_58,&local_60);
      while( true ) {
        local_68._M_current =
             (cmLinkItem *)
             std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::end
                       ((vector<cmLinkItem,_std::allocator<cmLinkItem>_> *)iface);
        bVar1 = __gnu_cxx::operator!=(&local_58,&local_68);
        if (!bVar1) break;
        __obj = __gnu_cxx::
                __normal_iterator<const_cmLinkItem_*,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_>
                ::operator*(&local_58);
        cmsys::
        hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
        ::insert(&local_80,
                 (hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
                  *)&li,&__obj->super_string);
        __gnu_cxx::
        __normal_iterator<const_cmLinkItem_*,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_>
        ::operator++(&local_58);
      }
      TVar2 = GetType(this);
      if (TVar2 != INTERFACE_LIBRARY) {
        li_1._M_current = (cmLinkImplItem *)GetLinkImplementation(this,config);
        local_a0._M_current =
             (cmLinkImplItem *)
             std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>::begin
                       ((vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_> *)li_1._M_current);
        while( true ) {
          local_a8._M_current =
               (cmLinkImplItem *)
               std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>::end(li_1._M_current);
          bVar1 = __gnu_cxx::operator!=(&local_a0,&local_a8);
          if (!bVar1) break;
          pcVar4 = __gnu_cxx::
                   __normal_iterator<const_cmLinkImplItem_*,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>
                   ::operator*(&local_a0);
          cmsys::
          hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
          ::insert((pair<cmsys::_Hashtable_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>,_bool>
                    *)&impl_1,
                   (hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
                    *)&li,(value_type *)pcVar4);
          if (((local_b0 & 1U) != 0) &&
             (pcVar5 = __gnu_cxx::
                       __normal_iterator<const_cmLinkImplItem_*,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>
                       ::operator->(&local_a0),
             (pcVar5->super_cmLinkItem).Target != (cmGeneratorTarget *)0x0)) {
            pcVar5 = __gnu_cxx::
                     __normal_iterator<const_cmLinkImplItem_*,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>
                     ::operator->(&local_a0);
            TVar2 = GetType((pcVar5->super_cmLinkItem).Target);
            if (TVar2 == SHARED_LIBRARY) {
              pcVar4 = __gnu_cxx::
                       __normal_iterator<const_cmLinkImplItem_*,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>
                       ::operator*(&local_a0);
              std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::push_back
                        (&(iface->super_cmLinkInterface).SharedDeps,&pcVar4->super_cmLinkItem);
            }
          }
          __gnu_cxx::
          __normal_iterator<const_cmLinkImplItem_*,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>
          ::operator++(&local_a0);
        }
      }
      cmsys::
      hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
      ::~hash_set((hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
                   *)&li);
    }
  }
  bVar1 = LinkLanguagePropagatesToDependents(this);
  if ((bVar1) &&
     (suffix.field_2._8_8_ = GetLinkImplementation(this,config),
     (cmLinkImplementation *)suffix.field_2._8_8_ != (cmLinkImplementation *)0x0)) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(&(iface->super_cmLinkInterface).Languages,
                &((cmLinkImplementation *)suffix.field_2._8_8_)->Languages);
  }
  TVar2 = GetType(this);
  if (TVar2 == STATIC_LIBRARY) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_f0,"_",&local_f1);
    std::allocator<char>::~allocator((allocator<char> *)&local_f1);
    uVar7 = std::__cxx11::string::empty();
    if ((uVar7 & 1) == 0) {
      cmsys::SystemTools::UpperCase((string *)((long)&propName.field_2 + 8),config);
      std::__cxx11::string::operator+=(local_f0,(string *)(propName.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(propName.field_2._M_local_buf + 8));
    }
    else {
      std::__cxx11::string::operator+=(local_f0,"NOCONFIG");
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)local_138,"LINK_INTERFACE_MULTIPLICITY",
               (allocator *)((long)&config_reps + 7));
    std::allocator<char>::~allocator((allocator<char> *)((long)&config_reps + 7));
    std::__cxx11::string::operator+=((string *)local_138,local_f0);
    reps = GetProperty(this,(string *)local_138);
    if (reps == (char *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_170,"LINK_INTERFACE_MULTIPLICITY",&local_171);
      pcVar8 = GetProperty(this,&local_170);
      std::__cxx11::string::~string((string *)&local_170);
      std::allocator<char>::~allocator((allocator<char> *)&local_171);
      local_150 = pcVar8;
      if (pcVar8 != (char *)0x0) {
        __isoc99_sscanf(pcVar8,"%u",&(iface->super_cmLinkInterface).Multiplicity);
      }
    }
    else {
      __isoc99_sscanf(reps,"%u",&(iface->super_cmLinkInterface).Multiplicity);
    }
    std::__cxx11::string::~string((string *)local_138);
    std::__cxx11::string::~string(local_f0);
  }
  return;
}

Assistant:

void cmGeneratorTarget::ComputeLinkInterface(const std::string& config,
                                    cmOptionalLinkInterface &iface,
                                    cmGeneratorTarget const* headTarget) const
{
  if(iface.ExplicitLibraries)
    {
    if(this->GetType() == cmState::SHARED_LIBRARY
        || this->GetType() == cmState::STATIC_LIBRARY
        || this->GetType() == cmState::INTERFACE_LIBRARY)
      {
      // Shared libraries may have runtime implementation dependencies
      // on other shared libraries that are not in the interface.
      UNORDERED_SET<std::string> emitted;
      for(std::vector<cmLinkItem>::const_iterator
          li = iface.Libraries.begin(); li != iface.Libraries.end(); ++li)
        {
        emitted.insert(*li);
        }
      if (this->GetType() != cmState::INTERFACE_LIBRARY)
        {
        cmLinkImplementation const* impl =
            this->GetLinkImplementation(config);
        for(std::vector<cmLinkImplItem>::const_iterator
              li = impl->Libraries.begin(); li != impl->Libraries.end(); ++li)
          {
          if(emitted.insert(*li).second)
            {
            if(li->Target)
              {
              // This is a runtime dependency on another shared library.
              if(li->Target->GetType() == cmState::SHARED_LIBRARY)
                {
                iface.SharedDeps.push_back(*li);
                }
              }
            else
              {
              // TODO: Recognize shared library file names.  Perhaps this
              // should be moved to cmComputeLinkInformation, but that creates
              // a chicken-and-egg problem since this list is needed for its
              // construction.
              }
            }
          }
        }
      }
    }
  else if (this->GetPolicyStatusCMP0022() == cmPolicies::WARN
        || this->GetPolicyStatusCMP0022() == cmPolicies::OLD)
    {
    // The link implementation is the default link interface.
    cmLinkImplementationLibraries const*
      impl = this->GetLinkImplementationLibrariesInternal(config,
                                                          headTarget);
    iface.ImplementationIsInterface = true;
    iface.WrongConfigLibraries = impl->WrongConfigLibraries;
    }

  if(this->LinkLanguagePropagatesToDependents())
    {
    // Targets using this archive need its language runtime libraries.
    if(cmLinkImplementation const* impl =
       this->GetLinkImplementation(config))
      {
      iface.Languages = impl->Languages;
      }
    }

  if(this->GetType() == cmState::STATIC_LIBRARY)
    {
    // Construct the property name suffix for this configuration.
    std::string suffix = "_";
    if(!config.empty())
      {
      suffix += cmSystemTools::UpperCase(config);
      }
    else
      {
      suffix += "NOCONFIG";
      }

    // How many repetitions are needed if this library has cyclic
    // dependencies?
    std::string propName = "LINK_INTERFACE_MULTIPLICITY";
    propName += suffix;
    if(const char* config_reps = this->GetProperty(propName))
      {
      sscanf(config_reps, "%u", &iface.Multiplicity);
      }
    else if(const char* reps =
            this->GetProperty("LINK_INTERFACE_MULTIPLICITY"))
      {
      sscanf(reps, "%u", &iface.Multiplicity);
      }
    }
}